

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_string_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableStringFieldGenerator::GenerateBuildingCode
          (ImmutableStringFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  long in_RDI;
  char *in_stack_000001d0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_000001d8;
  Printer *in_stack_000001e0;
  
  FieldDescriptor::file(*(FieldDescriptor **)(in_RDI + 8));
  bVar1 = SupportFieldPresence((FileDescriptor *)0x5a03c8);
  if (bVar1) {
    io::Printer::Print(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0);
  }
  io::Printer::Print(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0);
  return;
}

Assistant:

void ImmutableStringFieldGenerator::GenerateBuildingCode(
    io::Printer* printer) const {
  if (SupportFieldPresence(descriptor_->file())) {
    printer->Print(variables_,
                   "if ($get_has_field_bit_from_local$) {\n"
                   "  $set_has_field_bit_to_local$;\n"
                   "}\n");
  }
  printer->Print(variables_, "result.$name$_ = $name$_;\n");
}